

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_rapidity_distribution
          (singleParticleSpectra *this,int event_id,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_imag,int flag)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDX;
  long in_RDI;
  int in_R8D;
  double dVar4;
  particleSamples *ppVar5;
  double dVar6;
  double sin_nphi;
  double cos_nphi;
  int iorder;
  double p_phi;
  double p_perp;
  double py_local;
  double px_local;
  double sin_theta;
  int rap_idx;
  double rap_local;
  double pmag;
  particle_info particle_local;
  int baryon;
  double mass;
  double E_local;
  double pz_local;
  int i_1;
  int number_of_particles;
  int j;
  int i;
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  particleSamples *in_stack_fffffffffffff7b0;
  double in_stack_fffffffffffff7b8;
  particleSamples *in_stack_fffffffffffff7c0;
  int local_7d4;
  double local_7a0;
  string *in_stack_fffffffffffff8c8;
  pretty_ostream *in_stack_fffffffffffff8d0;
  pretty_ostream *ppVar7;
  double local_6b0;
  pretty_ostream *local_640;
  double local_5c0;
  pretty_ostream *local_550;
  double local_4f0;
  pretty_ostream *local_4e8;
  double local_4d0;
  int local_4b0;
  double local_440;
  double local_3a0;
  double local_330;
  int local_2d0;
  double local_260;
  double local_1c0;
  double local_150;
  double local_f8;
  int local_f0;
  double local_d8;
  double local_d0;
  int local_84;
  double local_80;
  double local_78;
  double local_70;
  int local_68;
  allocator local_51;
  string local_50 [32];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x254); local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x1c8); local_2c = local_2c + 1) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_18,(long)local_28);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_2c);
      *pvVar3 = 0.0;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](local_20,(long)local_28);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_2c);
      *pvVar3 = 0.0;
    }
  }
  local_30 = 0;
  if (local_24 == 0) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16c693);
    local_30 = particleSamples::get_number_of_particles
                         (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
  }
  else if (local_24 == 1) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16c6c6);
    local_30 = particleSamples::get_number_of_positive_particles
                         (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
  }
  else {
    if (local_24 != 2) {
      pretty_ostream::operator<<
                ((pretty_ostream *)in_stack_fffffffffffff7b0,
                 (char (*) [34])CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      pretty_ostream::operator<<
                ((pretty_ostream *)in_stack_fffffffffffff7b0,
                 (char (*) [22])CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      pretty_ostream::operator<<
                ((pretty_ostream *)in_stack_fffffffffffff7b0,
                 (int *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"error",&local_51);
      pretty_ostream::flush(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      exit(1);
    }
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16c6f9);
    local_30 = particleSamples::get_number_of_negative_particles
                         (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
  }
  for (local_68 = 0; local_68 < local_30; local_68 = local_68 + 1) {
    local_70 = 0.0;
    local_78 = 0.0;
    local_80 = 0.0;
    local_84 = 0;
    if (local_24 == 0) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16c865);
      particleSamples::get_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_70 = local_d8;
      local_78 = local_d0;
      local_80 = local_f8;
      local_84 = local_f0;
    }
    else if (local_24 == 1) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16c8e8);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_70 = local_150;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16c926);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_78 = local_1c0;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16c964);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_80 = local_260;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16c9a2);
      particleSamples::get_positive_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_84 = local_2d0;
    }
    else if (local_24 == 2) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16c9ef);
      particleSamples::get_negative_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_70 = local_330;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16ca2d);
      particleSamples::get_negative_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_78 = local_3a0;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16ca6b);
      particleSamples::get_negative_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_80 = local_440;
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16caa9);
      particleSamples::get_negative_particle
                (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff7b8,0));
      local_84 = local_4b0;
    }
    dVar4 = sqrt(local_78 * local_78 + -(local_80 * local_80));
    if (*(int *)(in_RDI + 0x238) == 0) {
      local_4d0 = log((dVar4 + local_70) / (dVar4 - local_70));
    }
    else {
      local_4d0 = log((local_78 + local_70) / (local_78 - local_70));
    }
    local_4d0 = local_4d0 * 0.5;
    if (((*(double *)(in_RDI + 600) - *(double *)(in_RDI + 0x268) / 2.0 <= local_4d0) &&
        (iVar1 = (int)((local_4d0 - *(double *)(in_RDI + 600)) / *(double *)(in_RDI + 0x268) + 0.5),
        -1 < iVar1)) && (iVar1 < *(int *)(in_RDI + 0x254))) {
      ppVar7 = in_stack_fffffffffffff8d0;
      if (local_24 == 0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x270),(long)iVar1)
        ;
        *pvVar3 = local_4d0 + *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x288),(long)iVar1)
        ;
        *pvVar3 = *pvVar3 + 1.0;
        dVar4 = sqrt(1.0 - (local_70 * local_70) / (dVar4 * dVar4));
        if (local_84 == 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a0),
                              (long)iVar1);
          *pvVar3 = (local_78 - local_80) * dVar4 + *pvVar3;
          ppVar7 = in_stack_fffffffffffff8d0;
        }
        else if (local_84 == -1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a0),
                              (long)iVar1);
          *pvVar3 = (local_78 + local_80) * dVar4 + *pvVar3;
          ppVar7 = in_stack_fffffffffffff8d0;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a0),
                              (long)iVar1);
          *pvVar3 = local_78 * dVar4 + *pvVar3;
          ppVar7 = in_stack_fffffffffffff8d0;
        }
      }
      local_4e8 = (pretty_ostream *)0x0;
      local_4f0 = 0.0;
      if (local_24 == 0) {
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x16ce6e);
        particleSamples::get_particle
                  (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   SUB84(in_stack_fffffffffffff7b8,0));
        local_4e8 = local_550;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x16ceac);
        particleSamples::get_particle
                  (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   SUB84(in_stack_fffffffffffff7b8,0));
        local_4f0 = local_5c0;
        in_stack_fffffffffffff8d0 = ppVar7;
      }
      else if (local_24 == 1) {
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x16cefd);
        particleSamples::get_positive_particle
                  (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   SUB84(in_stack_fffffffffffff7b8,0));
        local_4e8 = local_640;
        std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x16cf3b);
        particleSamples::get_positive_particle
                  (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                   SUB84(in_stack_fffffffffffff7b8,0));
        local_4f0 = local_6b0;
        in_stack_fffffffffffff8d0 = ppVar7;
      }
      else {
        in_stack_fffffffffffff8d0 = ppVar7;
        if (local_24 == 2) {
          std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16cf88);
          particleSamples::get_negative_particle
                    (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                     SUB84(in_stack_fffffffffffff7b8,0));
          in_stack_fffffffffffff8d0 = ppVar7;
          std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16cfc6);
          particleSamples::get_negative_particle
                    (in_stack_fffffffffffff7c0,(int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                     SUB84(in_stack_fffffffffffff7b8,0));
          local_4f0 = local_7a0;
          local_4e8 = ppVar7;
        }
      }
      ppVar5 = (particleSamples *)
               sqrt((double)local_4e8 * (double)local_4e8 + local_4f0 * local_4f0);
      if ((*(double *)(in_RDI + 0x2b8) <= (double)ppVar5 &&
           (double)ppVar5 != *(double *)(in_RDI + 0x2b8)) &&
         ((double)ppVar5 < *(double *)(in_RDI + 0x2c0))) {
        dVar4 = atan2(local_4f0,(double)local_4e8);
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_18,(long)iVar1);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
        *pvVar3 = *pvVar3 + 1.0;
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](local_20,(long)iVar1);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
        *pvVar3 = (double)ppVar5 + *pvVar3;
        for (local_7d4 = 1; in_stack_fffffffffffff7c0 = ppVar5, local_7d4 < *(int *)(in_RDI + 0x1c8)
            ; local_7d4 = local_7d4 + 1) {
          dVar6 = cos((double)local_7d4 * dVar4);
          in_stack_fffffffffffff7b8 = sin((double)local_7d4 * dVar4);
          pvVar2 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](local_18,(long)iVar1);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_7d4);
          *pvVar3 = dVar6 + *pvVar3;
          pvVar2 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](local_20,(long)iVar1);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_7d4);
          *pvVar3 = in_stack_fffffffffffff7b8 + *pvVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_rapidity_distribution(
    int event_id, vector<vector<double>> &event_Qn_real,
    vector<vector<double>> &event_Qn_imag, int flag) {
    // first clean the results arrays
    for (int i = 0; i < N_rap; i++) {
        for (int j = 0; j < order_max; j++) {
            event_Qn_real[i][j] = 0.0;
            event_Qn_imag[i][j] = 0.0;
        }
    }

    int number_of_particles = 0;
    if (flag == 0) {
        number_of_particles = particle_list->get_number_of_particles(event_id);
    } else if (flag == 1) {
        number_of_particles =
            (particle_list->get_number_of_positive_particles(event_id));
    } else if (flag == 2) {
        number_of_particles =
            (particle_list->get_number_of_negative_particles(event_id));
    } else {
        messager << "calculate_rapidity_distribution: "
                 << "unrecogonized flag = " << flag;
        messager.flush("error");
        exit(1);
    }
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = 0.0;
        double E_local = 0.0;
        double mass = 0.0;
        int baryon = 0;
        if (flag == 0) {
            auto particle_local = particle_list->get_particle(event_id, i);
            pz_local = particle_local.pz;
            E_local = particle_local.E;
            mass = particle_local.mass;
            baryon = particle_local.baryon;
        } else if (flag == 1) {
            pz_local = particle_list->get_positive_particle(event_id, i).pz;
            E_local = particle_list->get_positive_particle(event_id, i).E;
            mass = particle_list->get_positive_particle(event_id, i).mass;
            baryon = particle_list->get_positive_particle(event_id, i).baryon;
        } else if (flag == 2) {
            pz_local = particle_list->get_negative_particle(event_id, i).pz;
            E_local = particle_list->get_negative_particle(event_id, i).E;
            mass = particle_list->get_negative_particle(event_id, i).mass;
            baryon = particle_list->get_negative_particle(event_id, i).baryon;
        }
        double pmag = sqrt(E_local * E_local - mass * mass);

        double rap_local = 0.0;
        if (rap_type == 0) {
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local < rapidity_dis_min - drap / 2.) continue;

        int rap_idx =
            static_cast<int>((rap_local - rapidity_dis_min) / drap + 0.5);
        if (rap_idx < 0 || rap_idx >= N_rap) continue;

        // no pT cut on particle yield
        if (flag == 0) {
            rapidity_array[rap_idx] += rap_local;
            dNdy_array[rap_idx]++;

            // compute the transverse energy
            // ALICE https://arxiv.org/pdf/1603.04775
            // PHENIX https://arxiv.org/pdf/nucl-ex/0409015
            double sin_theta = sqrt(1. - pz_local * pz_local / (pmag * pmag));
            if (baryon == 1) {
                dETdy_array[rap_idx] += (E_local - mass) * sin_theta;
            } else if (baryon == -1) {
                dETdy_array[rap_idx] += (E_local + mass) * sin_theta;
            } else {
                dETdy_array[rap_idx] += E_local * sin_theta;
            }
        }
        // calcualte vn
        double px_local = 0.0;
        double py_local = 0.0;
        if (flag == 0) {
            px_local = particle_list->get_particle(event_id, i).px;
            py_local = particle_list->get_particle(event_id, i).py;
        } else if (flag == 1) {
            px_local = particle_list->get_positive_particle(event_id, i).px;
            py_local = particle_list->get_positive_particle(event_id, i).py;
        } else if (flag == 2) {
            px_local = particle_list->get_negative_particle(event_id, i).px;
            py_local = particle_list->get_negative_particle(event_id, i).py;
        }
        double p_perp = sqrt(px_local * px_local + py_local * py_local);
        if (p_perp > vn_rapidity_dis_pT_min
            && p_perp < vn_rapidity_dis_pT_max) {
            double p_phi = atan2(py_local, px_local);
            event_Qn_real[rap_idx][0] += 1.;
            event_Qn_imag[rap_idx][0] += p_perp;  // record mean pT
            for (int iorder = 1; iorder < order_max; iorder++) {
                double cos_nphi = cos(iorder * p_phi);
                double sin_nphi = sin(iorder * p_phi);
                event_Qn_real[rap_idx][iorder] += cos_nphi;
                event_Qn_imag[rap_idx][iorder] += sin_nphi;
            }
        }
    }
}